

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O2

CoeffReturnType __thiscall
Eigen::internal::
product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
::coeff(product_evaluator<Eigen::Product<Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1>,_8,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
        *this,Index row,Index col)

{
  Scalar SVar1;
  PointerType local_148 [2];
  long local_138;
  XprTypeNested pRStack_130;
  long local_128;
  long lStack_120;
  Index local_118;
  MatrixBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>_>
  local_108 [56];
  Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>
  local_d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>_>
  local_98;
  
  Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>
  ::Block(&local_d0,this->m_lhs,row);
  local_118 = local_d0.
              super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
              .m_outerStride;
  local_128 = local_d0.
              super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
              .m_startRow.m_value;
  lStack_120 = local_d0.
               super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
               .m_startCol.m_value;
  local_138 = local_d0.
              super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_0>
              .m_cols.m_value;
  pRStack_130 = local_d0.
                super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
                .
                super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
                .m_xpr;
  local_148[0] = local_d0.
                 super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_0>
                 .m_data;
  local_148[1] = (PointerType)
                 local_d0.
                 super_BlockImpl<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_Eigen::Dense>
                 .
                 super_BlockImpl_dense<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false,_true>
                 .
                 super_MapBase<Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>,_0>
                 ._8_8_;
  Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>
  ::Block((Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>
           *)local_108,this->m_rhs,col);
  MatrixBase<Eigen::Transpose<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,-1,-1,0,-1,-1>,0,Eigen::OuterStride<-1>>const,1,-1,false>const>>
  ::
  cwiseProduct<Eigen::Block<Eigen::Ref<Eigen::Matrix<double,_1,_1,0,_1,_1>,0,Eigen::OuterStride<_1>>const,_1,1,true>>
            (&local_98,local_148,local_108);
  SVar1 = DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_1,_-1,_false>_>,_const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_0,_Eigen::OuterStride<-1>_>,_-1,_1,_true>_>_>
          ::sum((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_1,__1,_false>_>,_const_Eigen::Block<const_Eigen::Ref<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0,_Eigen::OuterStride<_1>_>,__1,_1,_true>_>_>
                 *)&local_98);
  return SVar1;
}

Assistant:

const CoeffReturnType coeff(Index row, Index col) const
  {
    return (m_lhs.row(row).transpose().cwiseProduct( m_rhs.col(col) )).sum();
  }